

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::EdgeChainSimplifier::EdgeChainSimplifier
          (EdgeChainSimplifier *this,S2Builder *builder,Graph *g,
          vector<int,_std::allocator<int>_> *edge_layers,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices,
          vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
          *layer_edges,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *layer_input_edge_ids,IdSetLexicon *input_edge_id_set_lexicon)

{
  VertexId VVar1;
  EdgeId EVar2;
  allocator<bool> local_46;
  allocator<bool> local_45 [13];
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_38;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *layer_edges_local;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *site_vertices_local;
  vector<int,_std::allocator<int>_> *edge_layers_local;
  Graph *g_local;
  S2Builder *builder_local;
  EdgeChainSimplifier *this_local;
  
  this->builder_ = builder;
  this->g_ = g;
  local_38 = layer_edges;
  layer_edges_local =
       (vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
        *)site_vertices;
  site_vertices_local =
       (vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
        *)edge_layers;
  edge_layers_local = (vector<int,_std::allocator<int>_> *)g;
  g_local = (Graph *)builder;
  builder_local = (S2Builder *)this;
  Graph::VertexInMap::VertexInMap(&this->in_,g);
  Graph::VertexOutMap::VertexOutMap(&this->out_,(Graph *)edge_layers_local);
  std::vector<int,_std::allocator<int>_>::vector
            (&this->edge_layers_,(vector<int,_std::allocator<int>_> *)site_vertices_local);
  this->site_vertices_ =
       (vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
        *)layer_edges_local;
  this->layer_edges_ = local_38;
  this->layer_input_edge_ids_ = layer_input_edge_ids;
  this->input_edge_id_set_lexicon_ = input_edge_id_set_lexicon;
  this->layer_begins_ = &this->builder_->layer_begins_;
  VVar1 = Graph::num_vertices((Graph *)edge_layers_local);
  std::allocator<bool>::allocator(local_45);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->is_interior_,(long)VVar1,local_45);
  std::allocator<bool>::~allocator(local_45);
  EVar2 = Graph::num_edges((Graph *)edge_layers_local);
  std::allocator<bool>::allocator(&local_46);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->used_,(long)EVar2,&local_46);
  std::allocator<bool>::~allocator(&local_46);
  std::vector<int,_std::allocator<int>_>::vector(&this->tmp_vertices_);
  std::vector<int,_std::allocator<int>_>::vector(&this->tmp_edges_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector(&this->new_edges_)
  ;
  std::vector<int,_std::allocator<int>_>::vector(&this->new_input_edge_ids_);
  std::vector<int,_std::allocator<int>_>::vector(&this->new_edge_layers_);
  EVar2 = Graph::num_edges((Graph *)edge_layers_local);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            (&this->new_edges_,(long)EVar2);
  EVar2 = Graph::num_edges((Graph *)edge_layers_local);
  std::vector<int,_std::allocator<int>_>::reserve(&this->new_input_edge_ids_,(long)EVar2);
  EVar2 = Graph::num_edges((Graph *)edge_layers_local);
  std::vector<int,_std::allocator<int>_>::reserve(&this->new_edge_layers_,(long)EVar2);
  return;
}

Assistant:

S2Builder::EdgeChainSimplifier::EdgeChainSimplifier(
    const S2Builder& builder, const Graph& g, const vector<int>& edge_layers,
    const vector<compact_array<InputVertexId>>& site_vertices,
    vector<vector<Edge>>* layer_edges,
    vector<vector<InputEdgeIdSetId>>* layer_input_edge_ids,
    IdSetLexicon* input_edge_id_set_lexicon)
    : builder_(builder), g_(g), in_(g), out_(g), edge_layers_(edge_layers),
      site_vertices_(site_vertices), layer_edges_(layer_edges),
      layer_input_edge_ids_(layer_input_edge_ids),
      input_edge_id_set_lexicon_(input_edge_id_set_lexicon),
      layer_begins_(builder_.layer_begins_),
      is_interior_(g.num_vertices()), used_(g.num_edges()) {
  new_edges_.reserve(g.num_edges());
  new_input_edge_ids_.reserve(g.num_edges());
  new_edge_layers_.reserve(g.num_edges());
}